

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::isNamespaceBindingActive
          (DOMLSSerializerImpl *this,XMLCh *prefix,XMLCh *uri)

{
  XMLCh XVar1;
  char16_t cVar2;
  char16_t cVar3;
  XMLCh *pXVar4;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar5;
  ulong uVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  char16_t *pcVar10;
  RefHashTableBucketElem<char16_t> *pRVar11;
  XMLSize_t getAt;
  bool bVar12;
  uint local_3c;
  
  getAt = (this->fNamespaceStack->
          super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>).
          fCurCount;
  local_3c = (uint)(prefix + 2);
  do {
    bVar12 = getAt == 0;
    getAt = getAt - 1;
    if (bVar12) {
      local_3c._0_1_ = 0;
      break;
    }
    pRVar5 = BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>::
             elementAt(&this->fNamespaceStack->
                        super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>
                       ,getAt);
    if ((prefix == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefix, uVar6 == 0)) {
      uVar6 = 0;
    }
    else {
      XVar1 = prefix[1];
      pXVar4 = prefix + 2;
      while (XVar1 != L'\0') {
        uVar6 = (ulong)(ushort)XVar1 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar1 = *pXVar4;
        pXVar4 = pXVar4 + 1;
      }
      uVar6 = uVar6 % pRVar5->fHashModulus;
    }
    pRVar11 = pRVar5->fBucketList[uVar6];
    if (pRVar11 != (RefHashTableBucketElem<char16_t> *)0x0) {
      do {
        bVar12 = StringHasher::equals((StringHasher *)&pRVar5->field_0x30,prefix,pRVar11->fKey);
        if (bVar12) goto LAB_0028a95c;
        pRVar11 = pRVar11->fNext;
      } while (pRVar11 != (RefHashTableBucketElem<char16_t> *)0x0);
    }
    pRVar11 = (RefHashTableBucketElem<char16_t> *)0x0;
LAB_0028a95c:
    if (pRVar11 == (RefHashTableBucketElem<char16_t> *)0x0) {
      pcVar7 = (char16_t *)0x0;
    }
    else {
      pcVar7 = pRVar11->fData;
    }
    if (pcVar7 != (char16_t *)0x0) {
      if (pcVar7 == uri) {
        local_3c = 1;
      }
      else {
        pcVar8 = uri;
        pcVar9 = pcVar7;
        pcVar10 = pcVar7;
        if (uri == (XMLCh *)0x0) {
LAB_0028a9a3:
          local_3c = (uint)(*pcVar9 == L'\0');
        }
        else {
          do {
            cVar2 = *pcVar10;
            pcVar9 = pcVar8;
            if (cVar2 == L'\0') goto LAB_0028a9a3;
            cVar3 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 == cVar3);
          local_3c = 0;
        }
      }
    }
  } while (pcVar7 == (char16_t *)0x0);
  return (bool)((byte)local_3c & 1);
}

Assistant:

bool DOMLSSerializerImpl::isNamespaceBindingActive(const XMLCh* prefix, const XMLCh* uri) const
{
    for(XMLSize_t i=fNamespaceStack->size();i>0;i--)
    {
        RefHashTableOf<XMLCh>* curNamespaceMap=fNamespaceStack->elementAt(i-1);
        const XMLCh* thisUri=curNamespaceMap->get((void*)prefix);
        // if the prefix has been declared, check if it binds to the correct namespace, otherwise, reports it isn't bound
        if(thisUri)
            return XMLString::equals(thisUri,uri);
    }
    return false;
}